

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3PendingListAppendVarint(PendingList **pp,sqlite3_int64 i)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  PendingList *pOld;
  long lVar7;
  u64 nBytes;
  
  pOld = *pp;
  if (pOld == (PendingList *)0x0) {
    iVar6 = sqlite3_initialize();
    if (iVar6 == 0) {
      pOld = (PendingList *)sqlite3Malloc(0x94);
    }
    else {
      pOld = (PendingList *)0x0;
    }
    if (pOld == (PendingList *)0x0) {
      return 7;
    }
    pOld->nSpace = 100;
    pOld->aData = (char *)(pOld + 1);
    pOld->nData = 0;
  }
  else if (pOld->nSpace < pOld->nData + 0xb) {
    iVar6 = pOld->nSpace * 2;
    iVar5 = sqlite3_initialize();
    nBytes = 0;
    if (iVar5 == 0) {
      uVar1 = iVar6 + 0x30;
      if (0 < (int)uVar1) {
        nBytes = (u64)uVar1;
      }
      pOld = (PendingList *)sqlite3Realloc(pOld,nBytes);
    }
    else {
      pOld = (PendingList *)0x0;
    }
    if (pOld == (PendingList *)0x0) {
      sqlite3_free(*pp);
      *pp = (PendingList *)0x0;
      return 7;
    }
    pOld->nSpace = iVar6;
    pOld->aData = (char *)(pOld + 1);
  }
  iVar6 = pOld->nData;
  pcVar2 = pOld->aData;
  lVar7 = 0;
  do {
    bVar4 = (byte)i;
    pcVar2[lVar7 + iVar6] = bVar4 | 0x80;
    lVar7 = lVar7 + 1;
    bVar3 = 0x7f < (ulong)i;
    i = (ulong)i >> 7;
  } while (bVar3);
  pcVar2[lVar7 + (long)iVar6 + -1] = bVar4;
  iVar6 = pOld->nData;
  pOld->nData = iVar6 + (int)lVar7;
  pOld->aData[lVar7 + iVar6] = '\0';
  *pp = pOld;
  return 0;
}

Assistant:

static int fts3PendingListAppendVarint(
  PendingList **pp,               /* IN/OUT: Pointer to PendingList struct */
  sqlite3_int64 i                 /* Value to append to data */
){
  PendingList *p = *pp;

  /* Allocate or grow the PendingList as required. */
  if( !p ){
    p = sqlite3_malloc(sizeof(*p) + 100);
    if( !p ){
      return SQLITE_NOMEM;
    }
    p->nSpace = 100;
    p->aData = (char *)&p[1];
    p->nData = 0;
  }
  else if( p->nData+FTS3_VARINT_MAX+1>p->nSpace ){
    int nNew = p->nSpace * 2;
    p = sqlite3_realloc(p, sizeof(*p) + nNew);
    if( !p ){
      sqlite3_free(*pp);
      *pp = 0;
      return SQLITE_NOMEM;
    }
    p->nSpace = nNew;
    p->aData = (char *)&p[1];
  }

  /* Append the new serialized varint to the end of the list. */
  p->nData += sqlite3Fts3PutVarint(&p->aData[p->nData], i);
  p->aData[p->nData] = '\0';
  *pp = p;
  return SQLITE_OK;
}